

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_transcode.cpp
# Opt level: O2

int __thiscall
ktx::CommandTranscode::OptionsTranscode::init(OptionsTranscode *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  allocator<char> local_ec;
  allocator<char> local_eb;
  allocator<char> local_ea;
  allocator<char> local_e9;
  element_type *local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  shared_ptr<const_cxxopts::Value> local_d8;
  string local_c0;
  string local_a0;
  string local_80;
  undefined1 local_60 [40];
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_e9);
  cxxopts::Options::add_options((OptionAdder *)local_60,(Options *)ctx,&local_38);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"target",&local_ea);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "Target transcode format. Block compressed transcode targets can only be saved in raw format. Case-insensitive.\nPossible options are: etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc | r8 | rg8 | rgb8 | rgba8.\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2."
             ,&local_eb);
  cxxopts::value<std::__cxx11::string>();
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_e8;
  local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_e0._M_pi;
  local_e8 = (element_type *)0x0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"<target>",&local_ec);
  cxxopts::OptionAdder::operator()((OptionAdder *)local_60,&local_80,&local_a0,&local_d8,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  iVar1 = std::__cxx11::string::~string((string *)&local_38);
  return iVar1;
}

Assistant:

void CommandTranscode::OptionsTranscode::init(cxxopts::Options& opts) {
    opts.add_options()
        ("target", "Target transcode format."
                   " Block compressed transcode targets can only be saved in raw format."
                   " Case-insensitive."
                   "\nPossible options are:"
                   " etc-rgb | etc-rgba | eac-r11 | eac-rg11 | bc1 | bc3 | bc4 | bc5 | bc7 | astc |"
                   " r8 | rg8 | rgb8 | rgba8."
                   "\netc-rgb is ETC1; etc-rgba, eac-r11 and eac-rg11 are ETC2.",
                   cxxopts::value<std::string>(), "<target>");
}